

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O3

StringPiece * __thiscall re2::StringGenerator::Next(StringGenerator *this)

{
  bool bVar1;
  pointer piVar2;
  pointer pcVar3;
  int iVar4;
  ulong uVar5;
  LogMessage LStack_198;
  
  if (this->hasnext_ == false) {
    LogMessage::LogMessage
              (&LStack_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/string_generator.cc"
               ,0x50,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_198.str_,"Check failed: hasnext_",0x16);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_198);
  }
  if (this->generate_null_ == true) {
    this->generate_null_ = false;
    pcVar3 = (pointer)0x0;
    iVar4 = 0;
  }
  else {
    (this->s_)._M_string_length = 0;
    *(this->s_)._M_dataplus._M_p = '\0';
    piVar2 = (this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar2) {
      uVar5 = 0;
      do {
        std::__cxx11::string::_M_append
                  ((char *)&this->s_,
                   (ulong)(this->alphabet_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[piVar2[uVar5]]._M_dataplus._M_p)
        ;
        uVar5 = uVar5 + 1;
        piVar2 = (this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(this->digits_).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2))
      ;
    }
    if (this->random_ == false) {
      bVar1 = IncrementDigits(this);
    }
    else {
      bVar1 = RandomDigits(this);
    }
    this->hasnext_ = bVar1;
    pcVar3 = (this->s_)._M_dataplus._M_p;
    iVar4 = (int)(this->s_)._M_string_length;
  }
  (this->sp_).ptr_ = pcVar3;
  (this->sp_).length_ = iVar4;
  return &this->sp_;
}

Assistant:

const StringPiece& StringGenerator::Next() {
  CHECK(hasnext_);
  if (generate_null_) {
    generate_null_ = false;
    sp_ = NULL;
    return sp_;
  }
  s_.clear();
  for (size_t i = 0; i < digits_.size(); i++) {
    s_ += alphabet_[digits_[i]];
  }
  hasnext_ = random_ ? RandomDigits() : IncrementDigits();
  sp_ = s_;
  return sp_;
}